

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O1

tadsobj_objid_and_ptr * __thiscall CVmObjTadsInhQueue::create_path(CVmObjTadsInhQueue *this)

{
  pfq_ele *ppVar1;
  tadsobj_objid_and_ptr *ptVar2;
  uint uVar3;
  tadsobj_objid_and_ptr *ptVar4;
  size_t __size;
  
  ppVar1 = this->head_;
  if (ppVar1 == (pfq_ele *)0x0) {
    __size = 0x10;
  }
  else {
    uVar3 = 0;
    do {
      uVar3 = (uVar3 + 1) - (uint)(ppVar1->obj == 0);
      ppVar1 = ppVar1->nxt;
    } while (ppVar1 != (pfq_ele *)0x0);
    __size = (ulong)uVar3 * 0x10 + 0x10;
  }
  ptVar2 = (tadsobj_objid_and_ptr *)malloc(__size);
  ptVar4 = ptVar2;
  for (ppVar1 = this->head_; ppVar1 != (pfq_ele *)0x0; ppVar1 = ppVar1->nxt) {
    if (ppVar1->obj != 0) {
      ptVar4->id = ppVar1->obj;
      ptVar4->objp = ppVar1->objp;
      ptVar4 = ptVar4 + 1;
    }
  }
  ptVar4->id = 0;
  ptVar4->objp = (CVmObjTads *)0x0;
  return ptVar2;
}

Assistant:

tadsobj_objid_and_ptr *create_path() const
    {
        /* count the elements in the queue */
        int cnt;
        pfq_ele *cur;
        for (cnt = 0, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only non-nil elements count */
            if (cur->obj != VM_INVALID_OBJ)
                ++cnt;
        }

        /* allocate the path */
        tadsobj_objid_and_ptr *path = (tadsobj_objid_and_ptr *)t3malloc(
            (cnt + 1) * sizeof(tadsobj_objid_and_ptr));

        /* initialize the path */
        tadsobj_objid_and_ptr *dst;
        for (dst = path, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only store non-nil elements */
            if (cur->obj != VM_INVALID_OBJ)
            {
                dst->id = cur->obj;
                dst->objp = cur->objp;
                ++dst;
            }
        }

        /* set the null last entry */
        dst->id = VM_INVALID_OBJ;
        dst->objp = 0;

        /* return the new path */
        return path;
    }